

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O2

ConstantRange __thiscall slang::ConstantRange::intersect(ConstantRange *this,ConstantRange other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  ConstantRange CVar6;
  int iVar7;
  int iVar8;
  
  bVar4 = overlaps(this,other);
  if (bVar4) {
    iVar1 = this->left;
    iVar2 = this->right;
    iVar3 = iVar1;
    if (iVar2 < iVar1) {
      iVar3 = iVar2;
    }
    iVar7 = other.right;
    iVar8 = other.left;
    iVar5 = iVar8;
    if (iVar7 < iVar8) {
      iVar5 = iVar7;
    }
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    if (iVar2 <= iVar7) {
      iVar7 = iVar2;
    }
    CVar6.right = iVar7;
    CVar6.left = iVar5;
  }
  else {
    CVar6.left = 0;
    CVar6.right = 0;
  }
  return CVar6;
}

Assistant:

ConstantRange ConstantRange::intersect(ConstantRange other) const {
    if (overlaps(other)) {
        ConstantRange result;
        result.left = std::max(lower(), other.lower());
        result.right = std::min(upper(), other.upper());
        return result;
    }
    return ConstantRange();
}